

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void ungroup_new_objs(Am_Object *cmd,Am_Value *new_sel)

{
  Am_Value local_78;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  undefined1 local_50 [8];
  Am_Value_List selected_objs;
  Am_Object obj;
  Am_Object local_28;
  Am_Object group;
  Am_Object selection_widget;
  Am_Value *new_sel_local;
  Am_Object *cmd_local;
  
  Am_Object::Am_Object(&group);
  Am_Object::Am_Object(&local_28);
  Am_Object::Am_Object((Am_Object *)&selected_objs.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_50);
  Am_Object::Am_Object(&local_60,cmd);
  Am_Get_Selection_Widget_For_Command(&local_58);
  Am_Object::operator=(&group,&local_58);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_60);
  Am_Object::Am_Object(&local_68,&group);
  Am_Value::Am_Value(&local_78,new_sel);
  Am_Get_Sel_Or_Param_In_Display_Order(&local_68,(Am_Value_List *)local_50,&local_28,&local_78);
  Am_Value::~Am_Value(&local_78);
  Am_Object::~Am_Object(&local_68);
  ungroup_objects_internal(cmd,&group,(Am_Value_List *)local_50,&local_28);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_50);
  Am_Object::~Am_Object((Am_Object *)&selected_objs.item);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&group);
  return;
}

Assistant:

void
ungroup_new_objs(Am_Object &cmd, Am_Value new_sel)
{
  Am_Object selection_widget, group, obj;
  Am_Value_List selected_objs;
  selection_widget = Am_Get_Selection_Widget_For_Command(cmd);
  Am_Get_Sel_Or_Param_In_Display_Order(selection_widget, selected_objs, group,
                                       new_sel);
  ungroup_objects_internal(cmd, selection_widget, selected_objs, group);
}